

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamin_file.hpp
# Opt level: O2

void __thiscall ByteStreamInFileLE::get64bitsBE(ByteStreamInFileLE *this,U8 *bytes)

{
  (*(this->super_ByteStreamInFile).super_ByteStreamIn._vptr_ByteStreamIn[1])(this,this->swapped,8);
  *bytes = this->swapped[7];
  bytes[1] = this->swapped[6];
  bytes[2] = this->swapped[5];
  bytes[3] = this->swapped[4];
  bytes[4] = this->swapped[3];
  bytes[5] = this->swapped[2];
  bytes[6] = this->swapped[1];
  bytes[7] = this->swapped[0];
  return;
}

Assistant:

inline void ByteStreamInFileLE::get64bitsBE(U8* bytes)
{
  getBytes(swapped, 8);
  bytes[0] = swapped[7];
  bytes[1] = swapped[6];
  bytes[2] = swapped[5];
  bytes[3] = swapped[4];
  bytes[4] = swapped[3];
  bytes[5] = swapped[2];
  bytes[6] = swapped[1];
  bytes[7] = swapped[0];
}